

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O2

int sptk::snack::dp_f0(float *fdata,int buff_size,int sdstep,double freq,F0_params *par,
                      float **f0p_pt,float **vuvp_pt,float **rms_speech_pt,float **acpkp_pt,
                      int *vecsize,int last_time,Buffer *buffer)

{
  frame_rec *pfVar1;
  int *piVar2;
  short *psVar3;
  float *pfVar4;
  bool bVar5;
  ulong uVar6;
  Stat *pSVar7;
  ulong uVar8;
  Frame *pFVar9;
  Frame *pFVar10;
  float *pfVar11;
  ushort uVar12;
  uint uVar13;
  float *pfVar14;
  Dprec *pDVar15;
  float *pfVar16;
  int iVar17;
  float *pfVar18;
  size_t size;
  long lVar19;
  float *pfVar20;
  short sVar21;
  long lVar22;
  ulong uVar23;
  char *__ptr;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  F0_params *par_00;
  uint uVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  double extraout_XMM0_Qa;
  float fVar33;
  size_t __size;
  Buffer *in_stack_fffffffffffffef8;
  Stat *local_f8;
  int ncand;
  float maxval;
  ulong local_a0;
  long local_98;
  double local_90;
  uint local_88;
  int local_84;
  int local_80;
  int samsds;
  int maxloc;
  float engref;
  Stat *local_70;
  float *local_68;
  F0_params *local_60;
  ulong local_58;
  float **local_50;
  float **local_48;
  ulong local_40;
  float *local_38;
  
  uVar6 = 0;
  if (buffer->pad <= buff_size) {
    uVar6 = ((long)buff_size - (long)buffer->pad) / (long)buffer->step;
  }
  local_50 = f0p_pt;
  local_48 = vuvp_pt;
  if (debug_level != 0) {
    fprintf(_stderr,"******* Computing %d dp frames ******** from %d points\n",uVar6 & 0xffffffff,
            buff_size);
  }
  iVar24 = (int)(freq / 2000.0);
  uVar13 = buffer->step;
  local_a0 = uVar6;
  local_68 = fdata;
  local_60 = par;
  if (1 < iVar24) {
    samsds = (int)(uVar13 * ((int)uVar6 + -1) + buffer->ncomp) / iVar24;
    if (samsds < 1) {
      return 1;
    }
    local_68 = downsample(fdata,buff_size,sdstep,freq,&samsds,iVar24,buffer->first_time,last_time,
                          &buffer->ncoeff,&buffer->ncoefft,buffer->b,&buffer->foutput,&buffer->co,
                          &buffer->mem,buffer->state,&buffer->fsize);
    if (local_68 == (float *)0x0) {
      __ptr = "can\'t get downsampled data.\n";
      __size = 0x1c;
      goto LAB_0011615f;
    }
    uVar13 = buffer->step;
  }
  local_84 = buffer->first_time;
  local_f8 = buffer->stat;
  pfVar11 = buffer->mem;
  iVar27 = (int)(freq * 0.02);
  iVar17 = (int)(freq * 0.03);
  uVar28 = (uint)local_a0;
  dVar32 = freq;
  local_80 = iVar24;
  if (((local_84 == 0) && ((int)uVar28 <= buffer->nframes_old)) && (local_f8 != (Stat *)0x0)) {
    uVar25 = buffer->memsize;
  }
  else {
    if (local_f8 != (Stat *)0x0) {
      ckfree(local_f8->stat);
      ckfree(local_f8->rms);
      ckfree(local_f8->rms_ratio);
      ckfree(local_f8);
    }
    if (pfVar11 != (float *)0x0) {
      ckfree(pfVar11);
    }
    local_f8 = (Stat *)ckalloc(0x18);
    size = (long)(int)uVar28 << 2;
    pfVar11 = (float *)ckalloc(size);
    local_f8->stat = pfVar11;
    pfVar11 = (float *)ckalloc(size);
    local_f8->rms = pfVar11;
    pfVar11 = (float *)ckalloc(size);
    local_f8->rms_ratio = pfVar11;
    uVar25 = iVar17 + iVar27;
    pfVar11 = (float *)ckalloc((long)(int)uVar25 * 4);
    uVar6 = 0;
    uVar23 = 0;
    if (0 < (int)uVar25) {
      uVar23 = (ulong)uVar25;
    }
    for (; uVar23 != uVar6; uVar6 = uVar6 + 1) {
      pfVar11[uVar6] = 0.0;
    }
    buffer->nframes_old = uVar28;
    buffer->memsize = uVar25;
    buffer->stat = local_f8;
    buffer->mem = pfVar11;
  }
  if (uVar28 != 0) {
    dVar31 = freq / 1000.0 + 2.0;
    lVar19 = (long)((iVar27 - iVar17) / 2);
    iVar24 = (int)dVar31;
    if (100 < iVar24) {
      fprintf(_stderr,"Optimim order (%d) exceeds that allowable (%d); reduce Fs\n",iVar24,100);
      iVar24 = 100;
      dVar31 = extraout_XMM0_Qa;
    }
    pfVar16 = fdata + lVar19;
    pfVar4 = fdata + buff_size;
    local_88 = (int)uVar25 / 2;
    pfVar18 = fdata;
    for (lVar22 = (long)(int)local_88; lVar22 < (int)uVar25; lVar22 = lVar22 + 1) {
      dVar31 = (double)(ulong)(uint)*pfVar18;
      pfVar11[lVar22] = *pfVar18;
      pfVar18 = pfVar18 + 1;
    }
    pfVar18 = pfVar16 + -(long)iVar27;
    local_90 = (double)(long)iVar17;
    local_70 = (Stat *)&local_f8->rms_ratio;
    lVar22 = (long)(int)uVar13;
    uVar25 = uVar25 - uVar13;
    uVar6 = 0;
    local_58 = 0;
    if (0 < (int)uVar25) {
      local_58 = (ulong)uVar25;
    }
    local_38 = pfVar11 + lVar19 + (int)local_88;
    local_40 = 0;
    if (0 < (int)uVar13) {
      local_40 = (ulong)uVar13;
    }
    uVar23 = 0;
    if (0 < (int)local_a0) {
      uVar23 = local_a0 & 0xffffffff;
    }
    pfVar20 = fdata + lVar19 + (long)local_90;
    local_98 = lVar22 * 4;
    for (; uVar6 != uVar23; uVar6 = uVar6 + 1) {
      pfVar14 = pfVar16 + (long)local_90;
      fVar29 = SUB84(dVar31,0);
      fVar30 = SUB84(dVar32,0);
      iVar27 = (int)buffer;
      pSVar7 = local_f8;
      if (((pfVar18 < fdata) || (pfVar16 < fdata)) || (pfVar4 < pfVar14)) {
        if (local_84 != 0) {
          if (((pfVar18 < fdata) && (fdata <= pfVar16)) && (pfVar14 <= pfVar4)) {
            fVar29 = get_similarity(iVar24,iVar17,(float *)0x0,pfVar16,local_f8->rms + uVar6,
                                    local_70->stat + uVar6,fVar29,fVar30,1,iVar27,
                                    in_stack_fffffffffffffef8);
            dVar31 = (double)(ulong)(uint)fVar29;
          }
          else {
            local_f8->rms[uVar6] = 0.0;
            local_f8->stat[uVar6] = 0.002;
            dVar31 = 5.26354424712089e-315;
            pSVar7 = local_70;
          }
          goto LAB_00115765;
        }
        if ((pfVar18 < fdata) && (pfVar14 <= pfVar4)) {
          fVar29 = get_similarity(iVar24,iVar17,pfVar11,local_38,local_f8->rms + uVar6,
                                  local_f8->rms_ratio + uVar6,fVar29,fVar30,0,iVar27,
                                  in_stack_fffffffffffffef8);
          dVar31 = (double)(ulong)(uint)fVar29;
          local_f8->stat[uVar6] = fVar29;
          uVar8 = local_58;
          pfVar14 = pfVar11;
          if (pfVar18 + lVar22 < fdata) {
            while (uVar8 != 0) {
              dVar31 = (double)(ulong)(uint)pfVar14[lVar22];
              *pfVar14 = pfVar14[lVar22];
              uVar8 = uVar8 - 1;
              pfVar14 = pfVar14 + 1;
            }
            for (uVar8 = 0; local_40 != uVar8; uVar8 = uVar8 + 1) {
              dVar31 = (double)(ulong)(uint)pfVar20[uVar8];
              pfVar11[(long)(int)uVar25 + uVar8] = pfVar20[uVar8];
            }
          }
        }
      }
      else {
        fVar29 = get_similarity(iVar24,iVar17,pfVar18,pfVar16,local_f8->rms + uVar6,
                                local_f8->rms_ratio + uVar6,fVar29,fVar30,0,iVar27,
                                in_stack_fffffffffffffef8);
        dVar31 = (double)(ulong)(uint)fVar29;
LAB_00115765:
        pSVar7->stat[uVar6] = SUB84(dVar31,0);
      }
      pfVar18 = pfVar18 + lVar22;
      pfVar16 = pfVar16 + lVar22;
      pfVar20 = (float *)((long)pfVar20 + local_98);
    }
    uVar28 = (uint)local_a0;
    uVar6 = (ulong)local_88;
    pfVar16 = fdata + (int)(uVar13 * uVar28);
    while ((pfVar16 = pfVar16 + -1, 0 < (int)uVar6 && (fdata <= pfVar16))) {
      pfVar11[uVar6 - 1] = *pfVar16;
      uVar6 = uVar6 - 1;
    }
  }
  if (local_f8 == (Stat *)0x0) {
    __ptr = "can\'t get stationarity\n";
    __size = 0x17;
LAB_0011615f:
    fwrite(__ptr,__size,1,_stderr);
    return 1;
  }
  pfVar11 = local_f8->stat;
  pfVar16 = local_f8->rms_ratio;
  if ((0 < (int)uVar28) && (buffer->first_time == 0)) {
    buffer->headF = buffer->headF->next;
  }
  uVar6 = 0;
  if (0 < (int)uVar28) {
    uVar6 = (ulong)uVar28;
  }
  par_00 = local_60;
  for (uVar23 = 0; uVar23 != uVar6; uVar23 = uVar23 + 1) {
    pFVar9 = buffer->headF;
    if (pFVar9 == buffer->tailF->prev) {
      if (5 < buffer->cir_buff_growth_count) {
        fprintf(_stderr,
                "too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n"
               );
        return 1;
      }
      if (debug_level != 0) {
        fprintf(_stderr,"allocating %d more frames for DP circ. buffer.\n",
                (ulong)(uint)buffer->size_cir_buffer);
      }
      pFVar9 = alloc_frame(buffer->nlags,par_00->n_cands);
      pfVar1 = buffer->headF;
      pfVar1->next = pFVar9;
      pFVar9->prev = pfVar1;
      for (iVar24 = 1; iVar24 < buffer->size_cir_buffer; iVar24 = iVar24 + 1) {
        pFVar10 = alloc_frame(buffer->nlags,par_00->n_cands);
        pFVar9->next = pFVar10;
        pFVar10->prev = pFVar9;
        pFVar9 = pFVar10;
      }
      pfVar1 = buffer->tailF;
      pFVar9->next = pfVar1;
      pfVar1->prev = pFVar9;
      buffer->cir_buff_growth_count = buffer->cir_buff_growth_count + 1;
      pFVar9 = buffer->headF;
    }
    pFVar9->rms = local_f8->rms[uVar23];
    get_fast_cands(fdata,local_68,(int)uVar23,buffer->step,buffer->size,local_80,buffer->start,
                   buffer->nlags,&engref,&maxloc,&maxval,pFVar9->cp,buffer->peaks,buffer->locs,
                   &ncand,par_00,&buffer->dbsize,&buffer->dbdata);
    pFVar9 = buffer->headF;
    piVar2 = buffer->locs;
    pDVar15 = pFVar9->dp;
    psVar3 = pDVar15->locs;
    pfVar4 = pDVar15->pvals;
    pfVar18 = buffer->peaks;
    local_98 = (long)ncand;
    for (lVar19 = 0; ncand != (int)lVar19; lVar19 = lVar19 + 1) {
      pfVar4[lVar19] = pfVar18[lVar19];
      psVar3[lVar19] = (short)piVar2[lVar19];
    }
    psVar3[lVar19] = -1;
    pfVar4[lVar19] = maxval;
    pfVar4 = pDVar15->mpvals;
    pfVar4[local_98] = maxval + buffer->vbias;
    uVar8 = (ulong)(uint)ncand;
    if (ncand < 1) {
      uVar8 = 0;
    }
    for (uVar26 = 0; uVar8 != uVar26; uVar26 = uVar26 + 1) {
      pfVar4[uVar26] = 1.0 - (1.0 - (float)piVar2[uVar26] * buffer->lagwt) * pfVar18[uVar26];
    }
    ncand = ncand + 1;
    pDVar15->ncands = (short)ncand;
    uVar12 = (ushort)*(undefined4 *)pFVar9->prev->dp;
    if ((short)uVar12 < 1) {
      uVar12 = 0;
    }
    for (lVar19 = 0; par_00 = local_60, lVar19 <= local_98; lVar19 = lVar19 + 1) {
      sVar21 = pFVar9->dp->locs[lVar19];
      if (sVar21 < 1) {
        fVar29 = 3.4028235e+38;
        uVar8 = 0;
        for (uVar26 = 0; sVar21 = (short)uVar8, uVar12 != uVar26; uVar26 = uVar26 + 1) {
          pDVar15 = pFVar9->prev->dp;
          if (pDVar15->locs[uVar26] < 1) {
            fVar30 = 0.0;
          }
          else {
            fVar30 = buffer->tfact_a * pfVar16[uVar23] +
                     buffer->tfact_s * pfVar11[uVar23] + buffer->tcost;
          }
          fVar30 = fVar30 + pDVar15->dpvals[uVar26];
          if (fVar30 < fVar29) {
            uVar8 = uVar26 & 0xffffffff;
            fVar29 = fVar30;
          }
        }
      }
      else {
        local_90 = (double)(int)sVar21;
        fVar29 = 3.4028235e+38;
        uVar8 = 0;
        for (uVar26 = 0; sVar21 = (short)uVar8, uVar12 != uVar26; uVar26 = uVar26 + 1) {
          sVar21 = pFVar9->prev->dp->locs[uVar26];
          if (sVar21 < 1) {
            fVar30 = buffer->tfact_a / pfVar16[uVar23] +
                     buffer->tfact_s * pfVar11[uVar23] + buffer->tcost;
          }
          else {
            dVar32 = log(local_90 / (double)(int)sVar21);
            fVar30 = (float)dVar32;
            fVar33 = ABS(buffer->ln2 + fVar30) + buffer->fdouble;
            if (ABS(fVar30) <= fVar33) {
              fVar33 = ABS(fVar30);
            }
            fVar30 = ABS(fVar30 - buffer->ln2) + buffer->fdouble;
            if (fVar33 <= fVar30) {
              fVar30 = fVar33;
            }
            fVar30 = fVar30 * buffer->freqwt;
            pFVar9 = buffer->headF;
          }
          fVar30 = fVar30 + pFVar9->prev->dp->dpvals[uVar26];
          if (fVar30 < fVar29) {
            uVar8 = uVar26 & 0xffffffff;
            fVar29 = fVar30;
          }
        }
      }
      if ((uVar23 == 0) && (buffer->first_time != 0)) {
        pDVar15 = pFVar9->dp;
        pDVar15->dpvals[lVar19] = pDVar15->mpvals[lVar19];
        sVar21 = 0;
      }
      else {
        pDVar15 = pFVar9->dp;
        pDVar15->dpvals[lVar19] = fVar29 + pDVar15->mpvals[lVar19];
      }
      pDVar15->prept[lVar19] = sVar21;
    }
    if ((long)uVar23 < (long)(int)(uVar28 - 1)) {
      buffer->headF = pFVar9->next;
    }
    if (1 < debug_level) {
      fprintf(_stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",(double)engref,(double)maxval,
              uVar23 & 0xffffffff,(ulong)(uint)maxloc);
    }
  }
  *vecsize = 0;
  iVar24 = (int)local_a0 + buffer->num_active_frames;
  buffer->num_active_frames = iVar24;
  if ((last_time == 0) && (iVar24 < buffer->size_frame_hist)) goto LAB_00115f84;
  if (debug_level != 0) {
    fprintf(_stderr,"available frames for backtracking: %d\n");
  }
  pFVar9 = buffer->headF;
  pDVar15 = pFVar9->dp;
  sVar21 = pDVar15->ncands;
  uVar6 = 0;
  iVar24 = 0;
  if (0 < sVar21) {
    iVar24 = (int)sVar21;
  }
  uVar23 = 0;
  fVar29 = 3.4028235e+38;
  for (; (long)iVar24 != uVar6; uVar6 = uVar6 + 1) {
    fVar30 = pDVar15->dpvals[uVar6];
    if (fVar30 < fVar29) {
      uVar23 = uVar6 & 0xffffffff;
    }
    if (fVar29 <= fVar30) {
      fVar30 = fVar29;
    }
    buffer->pcands[uVar6] = (int)pDVar15->prept[uVar6];
    fVar29 = fVar30;
  }
  if (last_time == 0) {
    uVar6 = 0;
    pFVar10 = pFVar9;
    do {
      pFVar10 = pFVar10->prev;
      bVar5 = true;
      for (lVar19 = 1; lVar19 < sVar21; lVar19 = lVar19 + 1) {
        if (*buffer->pcands != buffer->pcands[lVar19]) {
          bVar5 = false;
        }
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      if (bVar5) {
        buffer->cmpthF = pFVar10;
        uVar23 = (ulong)(uint)*buffer->pcands;
        bVar5 = true;
        if (debug_level != 0) {
          fprintf(_stderr,"paths went back %d frames before converging\n",uVar6);
          pFVar10 = buffer->cmpthF;
        }
        goto LAB_00115d3b;
      }
      for (uVar8 = 0; (long)iVar24 != uVar8; uVar8 = uVar8 + 1) {
        buffer->pcands[uVar8] = (int)pFVar10->dp->prept[buffer->pcands[uVar8]];
      }
    } while (pFVar10 != buffer->tailF);
    if (buffer->size_frame_out <= buffer->num_active_frames) goto LAB_00115d34;
    buffer->cmpthF = (Frame *)0x0;
    pFVar10 = (Frame *)0x0;
    bVar5 = false;
  }
  else {
LAB_00115d34:
    buffer->cmpthF = pFVar9;
    bVar5 = true;
    pFVar10 = pFVar9;
  }
LAB_00115d3b:
  uVar6 = 0;
  while (pFVar10 != buffer->tailF->prev && bVar5) {
    if (uVar6 == (uint)buffer->output_buf_size) {
      iVar24 = buffer->output_buf_size * 2;
      buffer->output_buf_size = iVar24;
      if (debug_level != 0) {
        fprintf(_stderr,"reallocating space for output frames: %d\n");
        iVar24 = buffer->output_buf_size;
      }
      pfVar11 = (float *)ckrealloc(buffer->rms_speech,(long)iVar24 << 2);
      buffer->rms_speech = pfVar11;
      pfVar11 = (float *)ckrealloc(buffer->f0p,(long)buffer->output_buf_size << 2);
      buffer->f0p = pfVar11;
      pfVar11 = (float *)ckrealloc(buffer->vuvp,(long)buffer->output_buf_size << 2);
      buffer->vuvp = pfVar11;
      pfVar11 = (float *)ckrealloc(buffer->acpkp,(long)buffer->output_buf_size << 2);
      buffer->acpkp = pfVar11;
    }
    else {
      pfVar11 = buffer->acpkp;
    }
    buffer->rms_speech[uVar6] = pFVar10->rms;
    pDVar15 = pFVar10->dp;
    iVar17 = (int)uVar23;
    pfVar11[uVar6] = pDVar15->pvals[iVar17];
    sVar21 = pDVar15->locs[iVar17];
    iVar24 = (int)sVar21;
    pfVar11 = buffer->vuvp;
    pfVar11[uVar6] = 1.0;
    uVar23 = (ulong)(uint)(int)pDVar15->prept[iVar17];
    if (sVar21 < 1) {
      pfVar16 = buffer->f0p;
      pfVar16[uVar6] = 0.0;
      pfVar11[uVar6] = 0.0;
    }
    else {
      fVar29 = (float)iVar24;
      iVar17 = iVar24 - buffer->start;
      if ((iVar17 != 0 && buffer->start <= iVar24) && (iVar24 < buffer->stop)) {
        pfVar16 = pFVar10->cp->correl;
        fVar30 = pfVar16[iVar17];
        fVar33 = (pfVar16[(long)iVar17 + 1] + pfVar16[(long)iVar17 + -1]) - (fVar30 + fVar30);
        fVar33 = fVar33 + fVar33;
        if (1e-06 < ABS(fVar33)) {
          fVar29 = fVar29 + (2.0 - (fVar30 * -8.0 +
                                   pfVar16[(long)iVar17 + 1] * 5.0 +
                                   pfVar16[(long)iVar17 + -1] * 3.0) / fVar33);
        }
      }
      pfVar16 = buffer->f0p;
      pfVar16[uVar6] = (float)(freq / (double)fVar29);
    }
    pFVar10 = pFVar10->prev;
    if (1 < debug_level) {
      fprintf(_stderr," i:%4d%8.1f%8.1f\n",(double)pfVar16[uVar6],(double)pfVar11[uVar6],
              uVar6 & 0xffffffff);
    }
    uVar6 = uVar6 + 1;
  }
  if (bVar5) {
    *vecsize = (int)uVar6;
    buffer->tailF = buffer->cmpthF->next;
    buffer->num_active_frames = buffer->num_active_frames - (int)uVar6;
  }
LAB_00115f84:
  if (debug_level != 0) {
    fprintf(_stderr,"writing out %d frames.\n",(ulong)(uint)*vecsize);
  }
  *local_50 = buffer->f0p;
  *local_48 = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  if (buffer->first_time != 0) {
    buffer->first_time = 0;
    return 0;
  }
  return 0;
}

Assistant:

dp_f0(float *fdata, int buff_size, int sdstep, double freq, F0_params *par,
      float **f0p_pt, float **vuvp_pt, float **rms_speech_pt, float **acpkp_pt,
      int *vecsize, int last_time, Buffer *buffer)
{
  float  maxval, engref, *sta, *rms_ratio, *dsdata;
  float  *downsample(float *input, int samsin, int state_idx, double freq,
                     int *samsout, int decimate, int first_time, int last_time,
                     int *ncoeff, int *ncoefft, float *b, float **foutput,
                     float **co, float **mem, float *state, int *fsize);
  register float ttemp, ftemp, ft1, ferr, err, errmin;
  register int  i, j, k, loc1, loc2;
  int   nframes, maxloc, ncand, ncandp, minloc,
        decimate, samsds;

  Stat *stat = NULL;

  nframes = get_Nframes((long) buff_size, buffer->pad, buffer->step); /* # of whole frames */

  if(debug_level)
    Fprintf(stderr,
	    "******* Computing %d dp frames ******** from %d points\n", nframes, buff_size);

  /* Now downsample the signal for coarse peak estimates. */

  decimate = (int)(freq/2000.0);    /* downsample to about 2kHz */
  if (decimate <= 1)
    dsdata = fdata;
  else {
    samsds = ((nframes-1) * buffer->step + buffer->ncomp) / decimate;
    if (samsds < 1)
      return 1;                     /* skip final frame if it is too small */
    dsdata = downsample(fdata, buff_size, sdstep, freq, &samsds, decimate, 
			buffer->first_time, last_time, &buffer->ncoeff,
                        &buffer->ncoefft, buffer->b, &buffer->foutput,
                        &buffer->co, &buffer->mem, buffer->state, &buffer->fsize);
    if (!dsdata) {
      Fprintf(stderr, "can't get downsampled data.\n");
      return 1;
    }
  }

  /* Get a function of the "stationarity" of the speech signal. */

  stat = get_stationarity(fdata, freq, buff_size, nframes, buffer->step, buffer->first_time,
                          buffer);
  if (!stat) { 
    Fprintf(stderr, "can't get stationarity\n");
    return(1);
  }
  sta = stat->stat;
  rms_ratio = stat->rms_ratio;

  /***********************************************************************/
  /* MAIN FUNDAMENTAL FREQUENCY ESTIMATION LOOP */
  /***********************************************************************/
  if(!buffer->first_time && nframes > 0) buffer->headF = buffer->headF->next;

  for(i = 0; i < nframes; i++) {
 
    /* NOTE: This buffer growth provision is probably not necessary.
       It was put in (with errors) by Derek Lin and apparently never
       tested.  My tests and analysis suggest it is completely
       superfluous. DT 9/5/96 */
    /* Dynamically allocating more space for the circular buffer */
    if(buffer->headF == buffer->tailF->prev){
      Frame *frm;

      if(buffer->cir_buff_growth_count > 5){
	Fprintf(stderr,
		"too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n",buffer->cir_buff_growth_count);
	return(1);
      }
      if(debug_level) 
	Fprintf(stderr, "allocating %d more frames for DP circ. buffer.\n", buffer->size_cir_buffer);
      frm = alloc_frame(buffer->nlags, par->n_cands);
      buffer->headF->next = frm;
      frm->prev = buffer->headF;
      for(k=1; k<buffer->size_cir_buffer; k++){
	frm->next = alloc_frame(buffer->nlags, par->n_cands);
	frm->next->prev = frm;
	frm = frm->next;
      }
      frm->next = buffer->tailF;
      buffer->tailF->prev = frm;
      buffer->cir_buff_growth_count++;
    }

    buffer->headF->rms = stat->rms[i];
    get_fast_cands(fdata, dsdata, i, buffer->step, buffer->size, decimate, buffer->start,
		   buffer->nlags, &engref, &maxloc,
		   &maxval, buffer->headF->cp, buffer->peaks, buffer->locs, &ncand, par,
		   &buffer->dbsize, &buffer->dbdata);
    
    /*    Move the peak value and location arrays into the dp structure */
    {
      register float *ftp1, *ftp2;
      register short *sp1;
      register int *sp2;
      
      for(ftp1 = buffer->headF->dp->pvals, ftp2 = buffer->peaks,
	  sp1 = buffer->headF->dp->locs, sp2 = buffer->locs, j=ncand; j--; ) {
	*ftp1++ = *ftp2++;
	*sp1++ = *sp2++;
      }
      *sp1 = -1;		/* distinguish the UNVOICED candidate */
      *ftp1 = maxval;
      buffer->headF->dp->mpvals[ncand] = buffer->vbias+maxval; /* (high cost if cor. is high)*/
    }

    /* Apply a lag-dependent weight to the peaks to encourage the selection
       of the first major peak.  Translate the modified peak values into
       costs (high peak ==> low cost). */
    for(j=0; j < ncand; j++){
      ftemp = 1.0f - ((float)buffer->locs[j] * buffer->lagwt);
      buffer->headF->dp->mpvals[j] = 1.0f - (buffer->peaks[j] * ftemp);
    }
    ncand++;			/* include the unvoiced candidate */
    buffer->headF->dp->ncands = ncand;

    /*********************************************************************/
    /*    COMPUTE THE DISTANCE MEASURES AND ACCUMULATE THE COSTS.       */
    /*********************************************************************/

    ncandp = buffer->headF->prev->dp->ncands;
    for(k=0; k<ncand; k++){	/* for each of the current candidates... */
      minloc = 0;
      errmin = FLT_MAX;
      if((loc2 = buffer->headF->dp->locs[k]) > 0) { /* current cand. is voiced */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  /*    Get cost due to inter-frame period change. */
	  loc1 = buffer->headF->prev->dp->locs[j];
	  if (loc1 > 0) { /* prev. was voiced */
	    ftemp = (float) log(((double) loc2) / loc1);
	    ttemp = (float) fabs(ftemp);
	    ft1 = (float) (buffer->fdouble + fabs(ftemp + buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ft1 = (float) (buffer->fdouble + fabs(ftemp - buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ferr = ttemp * buffer->freqwt;
	  } else {		/* prev. was unvoiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a / rms_ratio[i]);
	  }
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      } else {			/* this is the unvoiced candidate */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  
	  /*    Get voicing transition cost. */
	  if (buffer->headF->prev->dp->locs[j] > 0) { /* previous was voiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a * rms_ratio[i]);
	  }
	  else
	    ferr = 0.0;
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      }
      /* Now have found the best path from this cand. to prev. frame */
      if (buffer->first_time && i==0) {		/* this is the first frame */
	buffer->headF->dp->dpvals[k] = buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = 0;
      } else {
	buffer->headF->dp->dpvals[k] = errmin + buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = minloc;
      }
    } /*    END OF THIS DP FRAME */

    if (i < nframes - 1)
      buffer->headF = buffer->headF->next;
    
    if (debug_level >= 2) {
      Fprintf(stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",
	      i,engref,maxval,maxloc);
    }
    
  } /* end for (i ...) */

  /***************************************************************/
  /* DONE WITH FILLING DP STRUCTURES FOR THE SET OF SAMPLED DATA */
  /*    NOW FIND A CONVERGED DP PATH                             */
  /***************************************************************/

  *vecsize = 0;			/* # of output frames returned */

  buffer->num_active_frames += nframes;

  if( buffer->num_active_frames >= buffer->size_frame_hist  || last_time ){
    Frame *frm;
    int  num_paths, best_cand, frmcnt, checkpath_done = 1;
    float patherrmin;
      
    if(debug_level)
      Fprintf(stderr, "available frames for backtracking: %d\n",
buffer->num_active_frames);
      
    patherrmin = FLT_MAX;
    best_cand = 0;
    num_paths = buffer->headF->dp->ncands;

    /* Get the best candidate for the final frame and initialize the
       paths' backpointers. */
    frm = buffer->headF;
    for(k=0; k < num_paths; k++) {
      if (patherrmin > buffer->headF->dp->dpvals[k]){
	patherrmin = buffer->headF->dp->dpvals[k];
	best_cand = k;	/* index indicating the best candidate at a path */
      }
      buffer->pcands[k] = frm->dp->prept[k];
    }

    if(last_time){     /* Input data was exhausted. force final outputs. */
      buffer->cmpthF = buffer->headF;		/* Use the current frame as starting point. */
    } else {
      /* Starting from the most recent frame, trace back each candidate's
	 best path until reaching a common candidate at some past frame. */
      frmcnt = 0;
      while (1) {
	frm = frm->prev;
	frmcnt++;
	checkpath_done = 1;
	for(k=1; k < num_paths; k++){ /* Check for convergence. */
	  if(buffer->pcands[0] != buffer->pcands[k])
	    checkpath_done = 0;
	}
	if( ! checkpath_done) { /* Prepare for checking at prev. frame. */
	  for(k=0; k < num_paths; k++){
	    buffer->pcands[k] = frm->dp->prept[buffer->pcands[k]];
	  }
	} else {	/* All paths have converged. */
	  buffer->cmpthF = frm;
	  best_cand = buffer->pcands[0];
	  if(debug_level)
	    Fprintf(stderr,
		    "paths went back %d frames before converging\n",frmcnt);
	  break;
	}
	if(frm == buffer->tailF){	/* Used all available data? */
	  if( buffer->num_active_frames < buffer->size_frame_out) { /* Delay some more? */
	    checkpath_done = 0; /* Yes, don't backtrack at this time. */
	    buffer->cmpthF = NULL;
	  } else {		/* No more delay! Force best-guess output. */
	    checkpath_done = 1;
	    buffer->cmpthF = buffer->headF;
	    /*	    Fprintf(stderr,
		    "WARNING: no converging path found after going back %d frames, will use the lowest cost path\n",num_active_frames);*/
	  }
	  break;
	} /* end if (frm ...) */
      }	/* end while (1) */
    } /* end if (last_time) ... else */

    /*************************************************************/
    /* BACKTRACKING FROM cmpthF (best_cand) ALL THE WAY TO tailF    */
    /*************************************************************/
    i = 0;
    frm = buffer->cmpthF;	/* Start where convergence was found (or faked). */
    while( frm != buffer->tailF->prev && checkpath_done){
      if( i == buffer->output_buf_size ){ /* Need more room for outputs? */
	buffer->output_buf_size *= 2;
	if(debug_level)
	  Fprintf(stderr,
		  "reallocating space for output frames: %d\n",
		  buffer->output_buf_size);
	buffer->rms_speech = (float *) ckrealloc((void *) buffer->rms_speech,
				       sizeof(float) * buffer->output_buf_size);
	/*	spsassert(rms_speech, "rms_speech realloc failed in dp_f0()");*/
	buffer->f0p = (float *) ckrealloc((void *) buffer->f0p,
				sizeof(float) * buffer->output_buf_size);
	/*	spsassert(f0p, "f0p realloc failed in dp_f0()");*/
	buffer->vuvp = (float *) ckrealloc((void *) buffer->vuvp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(vuvp, "vuvp realloc failed in dp_f0()");*/
	buffer->acpkp = (float *) ckrealloc((void *) buffer->acpkp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(acpkp, "acpkp realloc failed in dp_f0()");*/
      }
      buffer->rms_speech[i] = frm->rms;
      buffer->acpkp[i] =  frm->dp->pvals[best_cand];
      loc1 = frm->dp->locs[best_cand];
      buffer->vuvp[i] = 1.0;
      best_cand = frm->dp->prept[best_cand];
      ftemp = (float) loc1;
      if(loc1 > 0) {		/* Was f0 actually estimated for this frame? */
	if (loc1 > buffer->start && loc1 < buffer->stop) { /* loc1 must be a local maximum. */
	  float cormax, cprev, cnext, den;
		  
	  j = loc1 - buffer->start;
	  cormax = frm->cp->correl[j];
	  cprev = frm->cp->correl[j+1];
	  cnext = frm->cp->correl[j-1];
	  den = (float) (2.0 * ( cprev + cnext - (2.0 * cormax) ));
	  /*
	   * Only parabolic interpolate if cormax is indeed a local 
	   * turning point. Find peak of curve that goes though the 3 points
	   */
		  
	  if (fabs(den) > 0.000001)
	    ftemp += 2.0f - ((((5.0f*cprev)+(3.0f*cnext)-(8.0f*cormax))/den));
	}
	buffer->f0p[i] = (float) (freq/ftemp);
      } else {		/* No valid estimate; just fake some arbitrary F0. */
	buffer->f0p[i] = 0;
	buffer->vuvp[i] = 0.0;
      }
      frm = frm->prev;
	  
      if (debug_level >= 2)
	Fprintf(stderr," i:%4d%8.1f%8.1f\n",i,buffer->f0p[i],buffer->vuvp[i]);
      /* f0p[i] starts from the most recent one */ 
      /* Need to reverse the order in the calling function */
      i++;
    } /* end while() */
    if (checkpath_done){
      *vecsize = i;
      buffer->tailF = buffer->cmpthF->next;
      buffer->num_active_frames -= *vecsize;
    }
  } /* end if() */

  if (debug_level)
    Fprintf(stderr, "writing out %d frames.\n", *vecsize);
  
  *f0p_pt = buffer->f0p;
  *vuvp_pt = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  /*  *acpkp_pt = acpkp;*/
  
  if(buffer->first_time) buffer->first_time = 0;
  return(0);
}